

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.h
# Opt level: O3

iter_type __thiscall
booster::locale::util::base_num_format<wchar_t>::format_time
          (base_num_format<wchar_t> *this,iter_type out,ios_base *ios,char_type_conflict fill,
          time_t time,string_type *format)

{
  pointer pwVar1;
  char_type_conflict *pcVar2;
  size_type sVar3;
  int iVar4;
  char_type_conflict cVar5;
  ios_info *this_00;
  time_put *ptVar6;
  long lVar7;
  uint uVar8;
  streambuf_type *psVar9;
  long lVar10;
  streamsize n;
  long lVar11;
  iter_type iVar12;
  time_t time_local;
  string_type str;
  vector<char,_std::allocator<char>_> tmp_buf;
  string tz;
  locale local_1e8;
  tm tm;
  basic_ostringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> tmp_out;
  ios_base local_138 [120];
  long alStack_c0 [18];
  
  psVar9 = out._M_sbuf;
  uVar8 = out._8_4_;
  time_local = time;
  this_00 = ios_info::get(ios);
  ios_info::time_zone_abi_cxx11_(&tz,this_00);
  std::vector<char,std::allocator<char>>::vector<char_const*,void>
            ((vector<char,std::allocator<char>> *)&tmp_buf,tz._M_dataplus._M_p,
             tz._M_dataplus._M_p + tz._M_string_length + 1,(allocator_type *)&tmp_out);
  if (tz._M_string_length == 0) {
    localtime_r(&time_local,(tm *)&tm);
  }
  else {
    iVar4 = parse_tz(&tz);
    time_local = time_local + iVar4;
    gmtime_r(&time_local,(tm *)&tm);
    if (iVar4 != 0) {
      tm.tm_zone = tmp_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
      tm.tm_gmtoff = (long)iVar4;
    }
  }
  std::__cxx11::wostringstream::wostringstream((wostringstream *)&tmp_out);
  std::locale::locale((locale *)&str,(locale *)(ios + 0xd0));
  ptVar6 = std::
           use_facet<std::time_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>>
                     ((locale *)&str);
  lVar11 = *(long *)((long)alStack_c0 + *(long *)(_tmp_out + -0x18));
  pwVar1 = (format->_M_dataplus)._M_p;
  std::time_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>::put
            (ptVar6,lVar11,lVar11 == 0,&tmp_out + *(long *)(_tmp_out + -0x18),fill,&tm,pwVar1,
             pwVar1 + format->_M_string_length);
  std::locale::~locale((locale *)&str);
  std::__cxx11::wstringbuf::str();
  std::locale::locale(&local_1e8,(locale *)(ios + 0xd0));
  sVar3 = str._M_string_length;
  std::locale::~locale(&local_1e8);
  lVar11 = *(long *)(ios + 0x10) - sVar3;
  if (lVar11 == 0 || *(long *)(ios + 0x10) < (long)sVar3) {
    lVar10 = 0;
  }
  else {
    lVar7 = 0;
    if ((*(uint *)(ios + 0x18) & 0xb0) != 0x20) {
      lVar7 = lVar11;
    }
    lVar10 = lVar11 - lVar7;
    if (0 < lVar7) {
      lVar11 = lVar11 + 1;
      do {
        if ((uVar8 & 1) == 0) {
          pcVar2 = *(char_type_conflict **)(psVar9 + 0x28);
          if (pcVar2 < *(char_type_conflict **)(psVar9 + 0x30)) {
            *pcVar2 = fill;
            *(char_type_conflict **)(psVar9 + 0x28) = pcVar2 + 1;
            cVar5 = fill;
          }
          else {
            cVar5 = (**(code **)(*(long *)psVar9 + 0x68))(psVar9,fill);
          }
          uVar8 = uVar8 & 0xff;
          if (cVar5 == -1) {
            uVar8 = 1;
          }
        }
        lVar11 = lVar11 + -1;
      } while (1 < lVar11);
    }
  }
  if ((0 < (long)str._M_string_length) && ((uVar8 & 1) == 0)) {
    (**(code **)(*(long *)psVar9 + 0x60))(psVar9,str._M_dataplus._M_p);
  }
  if (0 < lVar10) {
    lVar10 = lVar10 + 1;
    do {
      if ((uVar8 & 1) == 0) {
        pcVar2 = *(char_type_conflict **)(psVar9 + 0x28);
        if (pcVar2 < *(char_type_conflict **)(psVar9 + 0x30)) {
          *pcVar2 = fill;
          *(char_type_conflict **)(psVar9 + 0x28) = pcVar2 + 1;
          cVar5 = fill;
        }
        else {
          cVar5 = (**(code **)(*(long *)psVar9 + 0x68))(psVar9,fill);
        }
        uVar8 = uVar8 & 0xff;
        if (cVar5 == -1) {
          uVar8 = 1;
        }
      }
      lVar10 = lVar10 + -1;
    } while (1 < lVar10);
  }
  *(undefined8 *)(ios + 0x10) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)str._M_dataplus._M_p != &str.field_2) {
    operator_delete(str._M_dataplus._M_p);
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)&tmp_out);
  std::ios_base::~ios_base(local_138);
  if (tmp_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(tmp_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tz._M_dataplus._M_p != &tz.field_2) {
    operator_delete(tz._M_dataplus._M_p);
  }
  iVar12._8_4_ = uVar8;
  iVar12._M_sbuf = psVar9;
  iVar12._12_4_ = 0;
  return iVar12;
}

Assistant:

iter_type format_time(iter_type out,std::ios_base &ios,char_type fill,std::time_t time,string_type const &format) const
    {
        std::string tz = ios_info::get(ios).time_zone();
        std::tm tm;
        #if defined(__linux) || defined(__FreeBSD__) || defined(__APPLE__) 
        std::vector<char> tmp_buf(tz.c_str(),tz.c_str()+tz.size()+1);
        #endif
        if(tz.empty()) {
            #ifdef BOOSTER_WIN_NATIVE
            /// Windows uses TLS
            tm = *localtime(&time);
            #else
            localtime_r(&time,&tm);
            #endif
        }
        else  {
            int gmtoff = parse_tz(tz);
            time+=gmtoff;
            #ifdef BOOSTER_WIN_NATIVE
            /// Windows uses TLS
            tm = *gmtime(&time);
            #else
            gmtime_r(&time,&tm);
            #endif
            
            #if defined(__linux) || defined(__FreeBSD__) || defined(__APPLE__) 
            // These have extra fields to specify timezone
            if(gmtoff!=0) {
                // bsd and apple want tm_zone be non-const
                tm.tm_zone=&tmp_buf.front();
                tm.tm_gmtoff = gmtoff;
            }
            #endif
        }
        std::basic_ostringstream<char_type> tmp_out;
        std::use_facet<std::time_put<char_type> >(ios.getloc()).put(tmp_out,tmp_out,fill,&tm,format.c_str(),format.c_str()+format.size());
        string_type str = tmp_out.str();
        std::streamsize on_left=0,on_right = 0;
        std::streamsize points = 
            formatting_size_traits<char_type>::size(str,ios.getloc());
        if(points < ios.width()) {
            std::streamsize n = ios.width() - points;
            
            std::ios_base::fmtflags flags = ios.flags() & std::ios_base::adjustfield;
            
            //
            // we do not really know internal point, so we assume that it does not
            // exist. so according to the standard field should be right aligned
            //
            if(flags != std::ios_base::left)
                on_left = n;
            on_right = n - on_left;
        }
        while(on_left > 0) {
            *out++ = fill;
            on_left--;
        }
        std::copy(str.begin(),str.end(),out);
        while(on_right > 0) {
            *out++ = fill;
            on_right--;
        }
        ios.width(0);
        return out;
    }